

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O1

void RescalerExportRowExpand_SSE2(WebPRescaler *wrk)

{
  uint uVar1;
  uint8_t *puVar2;
  rescaler_t *prVar3;
  rescaler_t *prVar4;
  undefined1 auVar5 [16];
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  ulong uVar28;
  __m128i rounder;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  
  auVar20 = _DAT_0014ed60;
  puVar2 = wrk->dst;
  uVar24 = wrk->num_channels * wrk->dst_width;
  prVar3 = wrk->frow;
  uVar1 = wrk->fy_scale;
  if (wrk->y_accum == 0) {
    uVar23 = 0;
    if (7 < (int)uVar24) {
      uVar22 = 0;
      do {
        uVar23 = *(ulong *)(prVar3 + uVar22);
        uVar28 = *(ulong *)((long)(prVar3 + uVar22) + 8);
        uVar14 = *(ulong *)(prVar3 + uVar22 + 4);
        uVar15 = *(ulong *)((long)(prVar3 + uVar22 + 4) + 8);
        auVar30._0_8_ = (uVar23 >> 0x20) * (ulong)uVar1 + 0x80000000;
        auVar30._8_8_ = (uVar28 >> 0x20) * (ulong)uVar1 + 0x80000000;
        auVar32._0_8_ = (uVar14 >> 0x20) * (ulong)uVar1 + 0x80000000;
        auVar32._8_8_ = (uVar15 >> 0x20) * (ulong)uVar1 + 0x80000000;
        auVar35._0_8_ = (uVar23 & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar35._8_8_ = (uVar28 & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar29._0_8_ = (uVar14 & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar29._8_8_ = (uVar15 & 0xffffffff) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar35 = packssdw(auVar30 & auVar20 | auVar35,auVar32 & auVar20 | auVar29);
        sVar6 = auVar35._0_2_;
        sVar7 = auVar35._2_2_;
        sVar8 = auVar35._4_2_;
        sVar9 = auVar35._6_2_;
        sVar10 = auVar35._8_2_;
        sVar11 = auVar35._10_2_;
        sVar12 = auVar35._12_2_;
        sVar13 = auVar35._14_2_;
        *(ulong *)(puVar2 + uVar22) =
             CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar35[0xe] - (0xff < sVar13),
                      CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar35[0xc] - (0xff < sVar12),
                               CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar35[10] -
                                        (0xff < sVar11),
                                        CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar35[8] -
                                                 (0xff < sVar10),
                                                 CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar35[6]
                                                          - (0xff < sVar9),
                                                          CONCAT12((0 < sVar8) * (sVar8 < 0x100) *
                                                                   auVar35[4] - (0xff < sVar8),
                                                                   CONCAT11((0 < sVar7) *
                                                                            (sVar7 < 0x100) *
                                                                            auVar35[2] -
                                                                            (0xff < sVar7),
                                                                            (0 < sVar6) *
                                                                            (sVar6 < 0x100) *
                                                                            auVar35[0] -
                                                                            (0xff < sVar6))))))));
        uVar23 = uVar22 + 8;
        uVar28 = uVar22 + 0x10;
        uVar22 = uVar23;
      } while (uVar28 <= uVar24);
    }
    if ((int)uVar23 < (int)uVar24) {
      uVar23 = uVar23 & 0xffffffff;
      do {
        iVar26 = (int)((ulong)wrk->fy_scale * (ulong)prVar3[uVar23] + 0x80000000 >> 0x20);
        if (0xff < iVar26) {
          iVar26 = 0xff;
        }
        puVar2[uVar23] = (uint8_t)iVar26;
        uVar23 = uVar23 + 1;
      } while (uVar24 != uVar23);
    }
  }
  else {
    prVar4 = wrk->irow;
    uVar23 = 0;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)wrk->y_sub;
    uVar21 = SUB164((ZEXT416((uint)-wrk->y_accum) << 0x20) / auVar5,0);
    uVar25 = -uVar21;
    if (7 < (int)uVar24) {
      uVar22 = 0;
      do {
        uVar23 = *(ulong *)(prVar3 + uVar22);
        uVar28 = *(ulong *)((long)(prVar3 + uVar22) + 8);
        uVar14 = *(ulong *)(prVar3 + uVar22 + 4);
        uVar15 = *(ulong *)((long)(prVar3 + uVar22 + 4) + 8);
        uVar16 = *(ulong *)(prVar4 + uVar22);
        uVar17 = *(ulong *)((long)(prVar4 + uVar22) + 8);
        uVar18 = *(ulong *)(prVar4 + uVar22 + 4);
        uVar19 = *(ulong *)((long)(prVar4 + uVar22 + 4) + 8);
        auVar34._0_8_ =
             ((uVar16 >> 0x20) * (ulong)uVar21 + (uVar23 >> 0x20) * (ulong)uVar25 + 0x80000000 >>
             0x20) * (ulong)uVar1 + 0x80000000;
        auVar34._8_8_ =
             ((uVar17 >> 0x20) * (ulong)uVar21 + (uVar28 >> 0x20) * (ulong)uVar25 + 0x80000000 >>
             0x20) * (ulong)uVar1 + 0x80000000;
        auVar36._0_8_ =
             ((uVar18 >> 0x20) * (ulong)uVar21 + (uVar14 >> 0x20) * (ulong)uVar25 + 0x80000000 >>
             0x20) * (ulong)uVar1 + 0x80000000;
        auVar36._8_8_ =
             ((uVar19 >> 0x20) * (ulong)uVar21 + (uVar15 >> 0x20) * (ulong)uVar25 + 0x80000000 >>
             0x20) * (ulong)uVar1 + 0x80000000;
        auVar31._0_8_ =
             ((uVar16 & 0xffffffff) * (ulong)uVar21 + (uVar23 & 0xffffffff) * (ulong)uVar25 +
              0x80000000 >> 0x20) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar31._8_8_ =
             ((uVar17 & 0xffffffff) * (ulong)uVar21 + (uVar28 & 0xffffffff) * (ulong)uVar25 +
              0x80000000 >> 0x20) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar33._0_8_ =
             ((uVar18 & 0xffffffff) * (ulong)uVar21 + (uVar14 & 0xffffffff) * (ulong)uVar25 +
              0x80000000 >> 0x20) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar33._8_8_ =
             ((uVar19 & 0xffffffff) * (ulong)uVar21 + (uVar15 & 0xffffffff) * (ulong)uVar25 +
              0x80000000 >> 0x20) * (ulong)uVar1 + 0x80000000 >> 0x20;
        auVar35 = packssdw(auVar34 & auVar20 | auVar31,auVar36 & auVar20 | auVar33);
        sVar6 = auVar35._0_2_;
        sVar7 = auVar35._2_2_;
        sVar8 = auVar35._4_2_;
        sVar9 = auVar35._6_2_;
        sVar10 = auVar35._8_2_;
        sVar11 = auVar35._10_2_;
        sVar12 = auVar35._12_2_;
        sVar13 = auVar35._14_2_;
        *(ulong *)(puVar2 + uVar22) =
             CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar35[0xe] - (0xff < sVar13),
                      CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar35[0xc] - (0xff < sVar12),
                               CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar35[10] -
                                        (0xff < sVar11),
                                        CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar35[8] -
                                                 (0xff < sVar10),
                                                 CONCAT13((0 < sVar9) * (sVar9 < 0x100) * auVar35[6]
                                                          - (0xff < sVar9),
                                                          CONCAT12((0 < sVar8) * (sVar8 < 0x100) *
                                                                   auVar35[4] - (0xff < sVar8),
                                                                   CONCAT11((0 < sVar7) *
                                                                            (sVar7 < 0x100) *
                                                                            auVar35[2] -
                                                                            (0xff < sVar7),
                                                                            (0 < sVar6) *
                                                                            (sVar6 < 0x100) *
                                                                            auVar35[0] -
                                                                            (0xff < sVar6))))))));
        uVar23 = uVar22 + 8;
        uVar28 = uVar22 + 0x10;
        uVar22 = uVar23;
      } while (uVar28 <= uVar24);
    }
    if ((int)uVar23 < (int)uVar24) {
      uVar23 = uVar23 & 0xffffffff;
      do {
        iVar27 = (int)((ulong)wrk->fy_scale *
                       ((ulong)prVar4[uVar23] * (ulong)uVar21 +
                        (ulong)prVar3[uVar23] * (ulong)uVar25 + 0x80000000 >> 0x20) + 0x80000000 >>
                      0x20);
        iVar26 = 0xff;
        if (iVar27 < 0x100) {
          iVar26 = iVar27;
        }
        puVar2[uVar23] = (uint8_t)iVar26;
        uVar23 = uVar23 + 1;
      } while (uVar24 != uVar23);
    }
  }
  return;
}

Assistant:

static void RescalerExportRowExpand_SSE2(WebPRescaler* const wrk) {
  int x_out;
  uint8_t* const dst = wrk->dst;
  rescaler_t* const irow = wrk->irow;
  const int x_out_max = wrk->dst_width * wrk->num_channels;
  const rescaler_t* const frow = wrk->frow;
  const __m128i mult = _mm_set_epi32(0, wrk->fy_scale, 0, wrk->fy_scale);

  assert(!WebPRescalerOutputDone(wrk));
  assert(wrk->y_accum <= 0 && wrk->y_sub + wrk->y_accum >= 0);
  assert(wrk->y_expand);
  if (wrk->y_accum == 0) {
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3;
      LoadDispatchAndMult_SSE2(frow + x_out, NULL, &A0, &A1, &A2, &A3);
      ProcessRow_SSE2(&A0, &A1, &A2, &A3, &mult, dst + x_out);
    }
    for (; x_out < x_out_max; ++x_out) {
      const uint32_t J = frow[x_out];
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  } else {
    const uint32_t B = WEBP_RESCALER_FRAC(-wrk->y_accum, wrk->y_sub);
    const uint32_t A = (uint32_t)(WEBP_RESCALER_ONE - B);
    const __m128i mA = _mm_set_epi32(0, A, 0, A);
    const __m128i mB = _mm_set_epi32(0, B, 0, B);
    const __m128i rounder = _mm_set_epi32(0, ROUNDER, 0, ROUNDER);
    for (x_out = 0; x_out + 8 <= x_out_max; x_out += 8) {
      __m128i A0, A1, A2, A3, B0, B1, B2, B3;
      LoadDispatchAndMult_SSE2(frow + x_out, &mA, &A0, &A1, &A2, &A3);
      LoadDispatchAndMult_SSE2(irow + x_out, &mB, &B0, &B1, &B2, &B3);
      {
        const __m128i C0 = _mm_add_epi64(A0, B0);
        const __m128i C1 = _mm_add_epi64(A1, B1);
        const __m128i C2 = _mm_add_epi64(A2, B2);
        const __m128i C3 = _mm_add_epi64(A3, B3);
        const __m128i D0 = _mm_add_epi64(C0, rounder);
        const __m128i D1 = _mm_add_epi64(C1, rounder);
        const __m128i D2 = _mm_add_epi64(C2, rounder);
        const __m128i D3 = _mm_add_epi64(C3, rounder);
        const __m128i E0 = _mm_srli_epi64(D0, WEBP_RESCALER_RFIX);
        const __m128i E1 = _mm_srli_epi64(D1, WEBP_RESCALER_RFIX);
        const __m128i E2 = _mm_srli_epi64(D2, WEBP_RESCALER_RFIX);
        const __m128i E3 = _mm_srli_epi64(D3, WEBP_RESCALER_RFIX);
        ProcessRow_SSE2(&E0, &E1, &E2, &E3, &mult, dst + x_out);
      }
    }
    for (; x_out < x_out_max; ++x_out) {
      const uint64_t I = (uint64_t)A * frow[x_out]
                       + (uint64_t)B * irow[x_out];
      const uint32_t J = (uint32_t)((I + ROUNDER) >> WEBP_RESCALER_RFIX);
      const int v = (int)MULT_FIX(J, wrk->fy_scale);
      dst[x_out] = (v > 255) ? 255u : (uint8_t)v;
    }
  }
}